

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

char * CVmObjBigNum::compute_init_2op(vm_val_t *result,char *ext1,char *ext2)

{
  int iVar1;
  vm_obj_id_t obj;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *in_RDX;
  char *in_RSI;
  vm_val_t *in_RDI;
  char *new_ext;
  size_t new_prec;
  size_t in_stack_ffffffffffffffa8;
  char *ext;
  undefined8 in_stack_ffffffffffffffb0;
  char *local_8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  sVar3 = get_prec((char *)0x2b90fd);
  sVar4 = get_prec((char *)0x2b910c);
  if (sVar3 < sVar4) {
    get_prec((char *)0x2b911d);
  }
  iVar1 = is_nan((char *)0x2b912c);
  if (iVar1 == 0) {
    is_nan((char *)0x2b913b);
  }
  obj = create(iVar2,in_stack_ffffffffffffffa8);
  vm_val_t::set_obj(in_RDI,obj);
  local_8 = get_objid_ext(0);
  iVar2 = get_type(in_RSI);
  if (iVar2 == 0) {
    iVar2 = get_type(in_RDX);
    if (iVar2 != 0) {
      ext = local_8;
      iVar2 = get_type(in_RDX);
      set_type(ext,iVar2);
      iVar2 = get_neg(in_RDX);
      set_neg(local_8,iVar2);
      local_8 = (char *)0x0;
    }
  }
  else {
    iVar2 = get_type(in_RSI);
    set_type(local_8,iVar2);
    iVar2 = get_neg(in_RSI);
    set_neg(local_8,iVar2);
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

char *CVmObjBigNum::compute_init_2op(VMG_ vm_val_t *result,
                                     const char *ext1, const char *ext2)
{
    size_t new_prec;
    char *new_ext;

    /* get the greater precision - this is the precision of the result */
    new_prec = get_prec(ext1);
    if (get_prec(ext2) > new_prec)
        new_prec = get_prec(ext2);

    /* 
     *   if either operand is not an ordinary number, we need minimal
     *   precision to represent the result, since we don't actually need
     *   to store a number 
     */
    if (is_nan(ext1) || is_nan(ext2))
        new_prec = 1;

    /* allocate a new object with the required precision */
    result->set_obj(create(vmg_ FALSE, new_prec));

    /* get the extension buffer */
    new_ext = get_objid_ext(vmg_ result->val.obj);

    /* check the first value for NAN/INF conditions */
    if (get_type(ext1) != VMBN_T_NUM)
    {
        /* set the result to the same non-number type and sign */
        set_type(new_ext, get_type(ext1));
        set_neg(new_ext, get_neg(ext1));

        /* indicate that no further calculation is necessary */
        return 0;
    }

    /* check the second number for NAN/INF conditions */
    if (get_type(ext2) != VMBN_T_NUM)
    {
        /* set the result to the same non-number type and sign */
        set_type(new_ext, get_type(ext2));
        set_neg(new_ext, get_neg(ext2));

        /* indicate that no further calculation is necessary */
        return 0;
    }

    /* the operands are valid - return the new extension buffer */
    return new_ext;
}